

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  ushort uVar1;
  uint uVar2;
  BCReg BVar3;
  uint32_t uVar4;
  SnapShot *pSVar5;
  SnapEntry *pSVar6;
  int iVar7;
  BCReg BVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint8_t auStack_138 [264];
  
  uVar10 = pc[1] >> 8 & 0xff;
  iVar7 = (pc[1] >> 0x10) - 0x8000;
  if (cond == 0) {
    iVar7 = 0;
  }
  uVar12 = (ulong)(J->cur).nsnap;
  pSVar5 = (J->cur).snap;
  (J->cur).snapmap[(uint)pSVar5[uVar12 - 1].nent + pSVar5[uVar12 - 1].mapofs] =
       (int)pc + 8 + iVar7 * 4;
  J->needsnap = '\x01';
  if (J->maxslot <= uVar10) {
    pSVar5 = (J->cur).snap;
    uVar1 = (J->cur).nsnap;
    uVar10 = pSVar5[(ulong)uVar1 - 1].mapofs;
    pSVar6 = (J->cur).snapmap;
    uVar12 = (ulong)pSVar5[(ulong)uVar1 - 1].nent;
    uVar2 = J->maxslot;
    BVar3 = J->baseslot;
    BVar8 = snap_usedef(J,auStack_138,(BCIns *)(ulong)pSVar6[uVar10 + uVar12],uVar2);
    if (BVar8 < uVar2) {
      snap_useuv(J->pt,auStack_138);
    }
    pSVar5[(ulong)uVar1 - 1].nslots = (uint8_t)(uVar2 + BVar3);
    if (uVar12 == 0) {
      uVar9 = 0;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      uVar9 = 0;
      do {
        uVar13 = pSVar6[uVar10 + uVar11] >> 0x18;
        if ((uVar13 < BVar8 + BVar3) ||
           ((uVar13 < uVar2 + BVar3 && (auStack_138[uVar13 - BVar3] == '\0')))) {
          uVar14 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          pSVar6[uVar10 + uVar14] = pSVar6[uVar10 + uVar11];
        }
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
    pSVar5[(ulong)uVar1 - 1].nent = (uint8_t)uVar9;
    uVar2 = pSVar5[(ulong)uVar1 - 1].mapofs;
    uVar4 = (J->cur).nsnapmap;
    for (; (uint)uVar11 <= ~uVar2 + uVar4; uVar11 = (ulong)((uint)uVar11 + 1)) {
      uVar12 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
      pSVar6[uVar10 + uVar12] = pSVar6[(ulong)uVar10 + (uVar11 & 0xffffffff)];
    }
    (J->cur).nsnapmap = uVar9 + pSVar5[(ulong)uVar1 - 1].mapofs;
    return;
  }
  J->maxslot = uVar10;
  lj_snap_shrink(J);
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
#if LJ_FR2
  SnapEntry *flink = &J->cur.snapmap[snap->mapofs + snap->nent];
  uint64_t pcbase;
  memcpy(&pcbase, flink, sizeof(uint64_t));
  pcbase = (pcbase & 0xff) | (u64ptr(npc) << 8);
  memcpy(flink, &pcbase, sizeof(uint64_t));
#else
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
#endif
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}